

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attached_database.cpp
# Opt level: O3

void __thiscall duckdb::AttachedDatabase::~AttachedDatabase(AttachedDatabase *this)

{
  ~AttachedDatabase(this);
  operator_delete(this);
  return;
}

Assistant:

AttachedDatabase::~AttachedDatabase() {
	Close();
}